

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_8::TileBuffer::TileBuffer(TileBuffer *this)

{
  Format FVar1;
  Array2D<unsigned_int> *in_RDI;
  Array2D<unsigned_int> *compressor;
  
  compressor = in_RDI;
  Array2D<unsigned_int>::Array2D(in_RDI);
  in_RDI[1]._sizeX = 0;
  in_RDI[1]._sizeY = 0;
  in_RDI[1]._data = (uint *)0x0;
  in_RDI[2]._sizeY = 0;
  FVar1 = defaultFormat((Compressor *)compressor);
  *(Format *)&in_RDI[2]._data = FVar1;
  *(undefined4 *)((long)&compressor[2]._data + 4) = 0xffffffff;
  *(undefined4 *)&compressor[3]._sizeX = 0xffffffff;
  *(undefined4 *)((long)&compressor[3]._sizeX + 4) = 0xffffffff;
  *(undefined4 *)&compressor[3]._sizeY = 0xffffffff;
  *(undefined1 *)((long)&compressor[3]._sizeY + 4) = 0;
  std::__cxx11::string::string((string *)&compressor[3]._data);
  IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(compressor + 5),1);
  return;
}

Assistant:

TileBuffer::TileBuffer ():
    uncompressedData (0),
    buffer (0),
    dataSize (0),
    compressor (0),
    format (defaultFormat (compressor)),
    dx (-1),
    dy (-1),
    lx (-1),
    ly (-1),
    hasException (false),
    exception (),
    _sem (1)
{
    // empty
}